

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

Prim * tinyusdz::tydra::GetParentPrim(Stage *stage,Path *path,string *err)

{
  bool bVar1;
  long *plVar2;
  undefined1 in_CL;
  char *pcVar3;
  value_type pPVar4;
  size_type *psVar5;
  char *pcVar6;
  Prim *pPVar7;
  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  Path parentPath;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [168];
  undefined1 local_108 [24];
  optional<tinyusdz::Path::PathType> local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48 [2];
  
  if (path->_valid == false) {
    if (err != (string *)0x0) {
      tinyusdz::to_string_abi_cxx11_
                ((string *)(local_1b0 + 0x18),(tinyusdz *)path,(Path *)0x1,(bool)in_CL);
      plVar2 = (long *)::std::__cxx11::string::replace
                                 ((ulong)(local_1b0 + 0x18),0,(char *)0x0,0x4183c0);
      pPVar4 = (value_type)(plVar2 + 2);
      if ((value_type)*plVar2 == pPVar4) {
        local_1b0._0_8_ = (pPVar4->_abs_path)._prim_part._M_dataplus._M_p;
        local_1b0._8_8_ = plVar2[3];
        local_1c0._0_8_ = (value_type)local_1b0;
      }
      else {
        local_1b0._0_8_ = (pPVar4->_abs_path)._prim_part._M_dataplus._M_p;
        local_1c0._0_8_ = (value_type)*plVar2;
      }
      local_1c0._8_8_ = plVar2[1];
      *plVar2 = (long)pPVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)::std::__cxx11::string::append(local_1c0);
      psVar5 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_e8._M_allocated_capacity = *psVar5;
        local_e8._8_8_ = plVar2[3];
        local_108._16_8_ = (Path *)&local_e8;
      }
      else {
        local_e8._M_allocated_capacity = *psVar5;
        local_108._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar2;
      }
      local_f0 = *(optional<tinyusdz::Path::PathType> *)(plVar2 + 1);
      *plVar2 = (long)psVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)err,(string *)(local_108 + 0x10));
      if ((Path *)local_108._16_8_ != (Path *)&local_e8) {
        operator_delete((void *)local_108._16_8_,local_e8._M_allocated_capacity + 1);
      }
      if ((value_type)local_1c0._0_8_ != (value_type)local_1b0) {
        operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._0_8_ + 1));
      }
      if ((undefined1 *)local_1b0._24_8_ != local_1b0 + 0x28) {
        operator_delete((void *)local_1b0._24_8_,local_1b0._40_8_ + 1);
      }
    }
  }
  else {
    if (((path->_prim_part)._M_string_length == 1) && (*(path->_prim_part)._M_dataplus._M_p == '/'))
    {
      if (err == (string *)0x0) {
        return (Prim *)0x0;
      }
      pcVar6 = (char *)err->_M_string_length;
      pcVar3 = "Input Path is root(\"/\").\n";
    }
    else {
      bVar1 = Path::is_root_prim(path);
      if (bVar1) {
        if (err == (string *)0x0) {
          return (Prim *)0x0;
        }
        pcVar6 = (char *)err->_M_string_length;
        pcVar3 = "Input Path is root Prim, so no parent Prim exists.\n";
      }
      else {
        if (((path->_prim_part)._M_string_length != 0) &&
           (*(path->_prim_part)._M_dataplus._M_p == '/')) {
          Path::get_parent_prim_path((Path *)(local_108 + 0x10),path);
          Stage::GetPrimAtPath_abi_cxx11_
                    ((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1c0,stage,(Path *)(local_108 + 0x10));
          pPVar7 = (Prim *)local_1c0._0_8_;
          if ((bool)local_1b0[0x10] != true) {
            if (err != (string *)0x0) {
              tinyusdz::to_string_abi_cxx11_
                        ((string *)(local_1b0 + 0x58),(tinyusdz *)path,(Path *)0x1,(bool)in_CL);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_1b0 + 0x78),"Failed to get parent Prim from Path ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_1b0 + 0x58));
              plVar2 = (long *)::std::__cxx11::string::append((char *)(local_1b0 + 0x78));
              psVar5 = (size_type *)(plVar2 + 2);
              if ((size_type *)*plVar2 == psVar5) {
                local_1b0._72_8_ = *psVar5;
                local_1b0._80_8_ = plVar2[3];
                local_1b0._56_8_ = local_1b0 + 0x48;
              }
              else {
                local_1b0._72_8_ = *psVar5;
                local_1b0._56_8_ = (size_type *)*plVar2;
              }
              local_1b0._64_8_ = plVar2[1];
              *plVar2 = (long)psVar5;
              plVar2[1] = 0;
              *(undefined1 *)(plVar2 + 2) = 0;
              if ((bool)local_1b0[0x10] == true) {
                __assert_fail("! has_value()",
                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/expected.hpp"
                              ,0x881,
                              "error_type &nonstd::expected_lite::expected<const tinyusdz::Prim *, std::basic_string<char>>::error() & [T = const tinyusdz::Prim *, E = std::basic_string<char>]"
                             );
              }
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_1b0 + 0x98),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_1b0 + 0x38),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1c0);
              plVar2 = (long *)::std::__cxx11::string::append((char *)(local_1b0 + 0x98));
              psVar5 = (size_type *)(plVar2 + 2);
              if ((size_type *)*plVar2 == psVar5) {
                local_1b0._40_8_ = *psVar5;
                local_1b0._48_8_ = plVar2[3];
                local_1b0._24_8_ = local_1b0 + 0x28;
              }
              else {
                local_1b0._40_8_ = *psVar5;
                local_1b0._24_8_ = (size_type *)*plVar2;
              }
              local_1b0._32_8_ = plVar2[1];
              *plVar2 = (long)psVar5;
              plVar2[1] = 0;
              *(undefined1 *)(plVar2 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)err,local_1b0._24_8_);
              if ((undefined1 *)local_1b0._24_8_ != local_1b0 + 0x28) {
                operator_delete((void *)local_1b0._24_8_,local_1b0._40_8_ + 1);
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_1b0._152_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_1b0 + 0xa8)) {
                operator_delete((void *)local_1b0._152_8_,local_108._0_8_ + 1);
              }
              if ((undefined1 *)local_1b0._56_8_ != local_1b0 + 0x48) {
                operator_delete((void *)local_1b0._56_8_,local_1b0._72_8_ + 1);
              }
              if ((undefined1 *)local_1b0._120_8_ != local_1b0 + 0x88) {
                operator_delete((void *)local_1b0._120_8_,local_1b0._136_8_ + 1);
              }
              if ((undefined1 *)local_1b0._88_8_ != local_1b0 + 0x68) {
                operator_delete((void *)local_1b0._88_8_,local_1b0._104_8_ + 1);
              }
            }
            pPVar7 = (Prim *)0x0;
          }
          if (((local_1b0[0x10] & 1) == 0) && ((Prim *)local_1c0._0_8_ != (Prim *)local_1b0)) {
            operator_delete((void *)local_1c0._0_8_,local_1b0._0_8_ + 1);
          }
          if ((Path *)local_58._M_p != (Path *)local_48) {
            operator_delete(local_58._M_p,local_48[0]._M_allocated_capacity + 1);
          }
          if ((Path *)local_78._M_p != (Path *)&local_68) {
            operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
          }
          if ((Path *)local_98._M_p != (Path *)&local_88) {
            operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
          }
          if ((Path *)local_b8._M_p != (Path *)&local_a8) {
            operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
          }
          if ((Path *)local_d8._M_p != (Path *)&local_c8) {
            operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
          }
          if ((Path *)local_108._16_8_ == (Path *)&local_e8) {
            return pPVar7;
          }
          operator_delete((void *)local_108._16_8_,local_e8._M_allocated_capacity + 1);
          return pPVar7;
        }
        if (err == (string *)0x0) {
          return (Prim *)0x0;
        }
        pcVar6 = (char *)err->_M_string_length;
        pcVar3 = "Input Path must be absolute path(i.e. starts with \"/\").\n";
      }
    }
    ::std::__cxx11::string::_M_replace((ulong)err,0,pcVar6,(ulong)pcVar3);
  }
  return (Prim *)0x0;
}

Assistant:

const Prim *GetParentPrim(const tinyusdz::Stage &stage,
                          const tinyusdz::Path &path, std::string *err) {
  if (!path.is_valid()) {
    if (err) {
      (*err) = "Input Path " + tinyusdz::to_string(path) + " is invalid.\n";
    }
    return nullptr;
  }

  if (path.is_root_path()) {
    if (err) {
      (*err) = "Input Path is root(\"/\").\n";
    }
    return nullptr;
  }

  if (path.is_root_prim()) {
    if (err) {
      (*err) = "Input Path is root Prim, so no parent Prim exists.\n";
    }
    return nullptr;
  }

  if (!path.is_absolute_path()) {
    if (err) {
      (*err) = "Input Path must be absolute path(i.e. starts with \"/\").\n";
    }
    return nullptr;
  }

  tinyusdz::Path parentPath = path.get_parent_prim_path();

  nonstd::expected<const Prim *, std::string> ret =
      stage.GetPrimAtPath(parentPath);
  if (ret) {
    return ret.value();
  } else {
    if (err) {
      (*err) += "Failed to get parent Prim from Path " +
                tinyusdz::to_string(path) + ". Reason = " + ret.error() + "\n";
    }
    return nullptr;
  }
}